

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  Value *this_00;
  uint uVar13;
  ulong value;
  byte *pbVar14;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string local_e0;
  long *local_c0 [2];
  long local_b0 [2];
  Value local_a0;
  Value local_78;
  Value local_50;
  
  pbVar3 = (byte *)token->start_;
  pbVar4 = (byte *)token->end_;
  if (pbVar3 != pbVar4) {
    lVar8 = 0;
    bVar7 = false;
    do {
      bVar5 = !bVar7;
      bVar7 = true;
      if (bVar5) {
        uVar13 = pbVar3[lVar8] - 0x2b;
        if (uVar13 < 0x3b) {
          if ((0x400000004000009U >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
            if ((ulong)uVar13 != 2) goto LAB_005d1223;
            bVar7 = lVar8 != 0;
          }
        }
        else {
LAB_005d1223:
          bVar7 = false;
        }
      }
      lVar6 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (pbVar3 + lVar6 != pbVar4);
    if (bVar7) {
LAB_005d122c:
      bVar7 = decodeDouble(this,token,decoded);
      return bVar7;
    }
  }
  bVar1 = *pbVar3;
  value = 0;
  if (bVar1 == 0x2d) {
    uVar12 = 0x8000000000000000;
  }
  else {
    uVar12 = 0xffffffffffffffff;
  }
  pbVar14 = pbVar3 + (bVar1 == 0x2d);
  if (pbVar14 < pbVar4) {
    value = 0;
    do {
      bVar2 = *pbVar14;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,pbVar3,pbVar4);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x64ea75);
        plVar10 = plVar9 + 2;
        if ((long *)*plVar9 == plVar10) {
          local_f0 = *plVar10;
          lStack_e8 = plVar9[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar10;
          local_100 = (long *)*plVar9;
        }
        local_f8 = plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0.field_2._8_8_ = plVar9[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_e0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        addError(this,&local_e0,token,(Location)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
        return false;
      }
      pbVar14 = pbVar14 + 1;
      uVar13 = bVar2 - 0x30;
      if ((uVar12 / 10 <= value) &&
         (((uVar12 / 10 < value || (pbVar14 != pbVar4)) || (uVar12 % 10 < (ulong)uVar13))))
      goto LAB_005d122c;
      value = (ulong)uVar13 + value * 10;
    } while (pbVar14 < pbVar4);
  }
  if (bVar1 == 0x2d) {
    Value::Value(&local_50,-value);
    Value::operator=(decoded,&local_50);
    this_00 = &local_50;
  }
  else if (value < 0x80000000) {
    Value::Value(&local_78,value);
    Value::operator=(decoded,&local_78);
    this_00 = &local_78;
  }
  else {
    Value::Value(&local_a0,value);
    Value::operator=(decoded,&local_a0);
    this_00 = &local_a0;
  }
  Value::~Value(this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}